

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O0

FilterPolicy * leveldb::NewBloomFilterPolicy(int bits_per_key)

{
  BloomFilterPolicy *this;
  int bits_per_key_local;
  
  this = (BloomFilterPolicy *)operator_new(0x18);
  anon_unknown_1::BloomFilterPolicy::BloomFilterPolicy(this,bits_per_key);
  return &this->super_FilterPolicy;
}

Assistant:

const FilterPolicy* NewBloomFilterPolicy(int bits_per_key) {
  return new BloomFilterPolicy(bits_per_key);
}